

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> __thiscall kj::_::FiberBase::fire(FiberBase *this)

{
  Event *extraout_RDX;
  long in_RSI;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> MVar1;
  Fault f;
  DebugComparison<kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)_&,_kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)>
  _kjCondition;
  Fault local_38;
  DebugComparison<kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)_&,_kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)>
  local_30;
  
  local_30.left = (anon_enum_32 *)(in_RSI + 0x50);
  local_30.result = *(int *)(in_RSI + 0x50) == 0;
  local_30.right = WAITING;
  local_30.op.content.ptr = " == ";
  local_30.op.content.size_ = 5;
  if (local_30.result) {
    *(undefined4 *)(in_RSI + 0x50) = 1;
    FiberStack::switchToFiber(*(FiberStack **)(in_RSI + 0x70));
    (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)0x0;
    (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
    MVar1.ptr.ptr = extraout_RDX;
    MVar1.ptr.disposer = (Disposer *)this;
    return (Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>)MVar1.ptr;
  }
  Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::FiberBase::_unnamed_type_1_&,_unnamed_type_1_>&>
            (&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,0x672,FAILED,"state == WAITING","_kjCondition,",&local_30);
  Debug::Fault::fatal(&local_38);
}

Assistant:

Maybe<Own<Event>> FiberBase::fire() {
  KJ_ASSERT(state == WAITING);
  state = RUNNING;
  stack->switchToFiber();
  return kj::none;
}